

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O3

void RDL_deleteCycleFams(RDL_cfURF *rc)

{
  ulong uVar1;
  
  if (rc->nofFams != 0) {
    uVar1 = 0;
    do {
      free(rc->fams[uVar1]->prototype);
      free(rc->fams[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < rc->nofFams);
  }
  free(rc->fams);
  free(rc);
  return;
}

Assistant:

void RDL_deleteCycleFams(RDL_cfURF *rc)
{
  unsigned i;
  for(i=0; i<rc->nofFams; ++i)
  {
    free(rc->fams[i]->prototype);
    free(rc->fams[i]);
  }
  free(rc->fams);
  free(rc);
}